

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wrestler.cpp
# Opt level: O0

void __thiscall fp_remover::classes::Wrestler::Wrestler(Wrestler *this,string *name)

{
  string local_38;
  string *local_18;
  string *name_local;
  Wrestler *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  Character::Character(&this->super_Character,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&this->first_name);
  std::__cxx11::string::string((string *)&this->last_name);
  std::__cxx11::string::string((string *)&this->nickname);
  return;
}

Assistant:

Wrestler::Wrestler(string name) : Character(name)
{

}